

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode UInt32_decodeBinary(UA_UInt32 *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  
  UVar1 = 0x80070000;
  if (pos + 4 <= end) {
    *dst = *(UA_UInt32 *)pos;
    pos = pos + 4;
    UVar1 = 0;
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
UInt32_decodeBinary(UA_UInt32 *dst, const UA_DataType *_) {
    if(pos + sizeof(UA_UInt32) > end)
        return UA_STATUSCODE_BADDECODINGERROR;
#if UA_BINARY_OVERLAYABLE_INTEGER
    memcpy(dst, pos, sizeof(UA_UInt32));
#else
    UA_decode32(pos, dst);
#endif
    pos += 4;
    return UA_STATUSCODE_GOOD;
}